

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_Line *line,ON_3dPoint *box_point,double *t0,double *t1)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool local_412;
  bool local_411;
  bool local_3d9;
  ON_Interval *local_398;
  ON_3dVector local_388;
  ON_3dVector local_370;
  double local_358;
  double dot;
  double local_348;
  double local_340;
  int local_338;
  bool local_331;
  int j_1;
  bool InNCone;
  ON_3dVector disp;
  ON_3dPoint cp_1;
  double tstar;
  ON_3dPoint corner;
  ON_3dPoint cp;
  double t;
  ON_3dVector ProjDir;
  ON_3dPoint vertex;
  ON_3dVector local_260;
  double local_248;
  double a;
  double amin;
  int iStack_230;
  int imin [3];
  int ihi [3];
  int ilo [3];
  undefined1 local_1f8 [8];
  ON_3dVector n;
  ON_3dVector StdUnit;
  int local_1c0;
  int k [3];
  double EndInd;
  double local_1a8;
  double local_1a0;
  ON_Interval local_198;
  int local_188;
  bool local_181;
  int i;
  bool nonempty;
  ON_Interval overlap;
  double local_168;
  ON_Interval local_160;
  ON_3dPoint local_150;
  ON_3dPoint local_138;
  ON_3dPoint local_120;
  ON_3dPoint local_108;
  ON_Interval local_f0;
  undefined1 local_e0 [8];
  ON_Interval pl;
  undefined1 local_c8 [4];
  int j;
  double adStack_c0 [5];
  ON_3dPoint local_98;
  undefined1 local_80 [8];
  ON_3dPoint center;
  undefined1 local_50 [8];
  ON_3dPoint closest;
  double *t1_local;
  double *t0_local;
  ON_3dPoint *box_point_local;
  ON_Line *line_local;
  ON_BoundingBox *this_local;
  
  closest.z = (double)t1;
  bVar1 = IsValid(this);
  if ((bVar1) && (bVar1 = ON_Line::IsValid(line), bVar1)) {
    ON_Line::Direction((ON_3dVector *)&center.z,line);
    dVar4 = ON_3dVector::Length((ON_3dVector *)&center.z);
    if (1.490116119385e-08 < dVar4) {
      local_398 = (ON_Interval *)local_c8;
      do {
        ON_Interval::ON_Interval(local_398);
        local_398 = local_398 + 1;
      } while ((ON_3dPoint *)local_398 != &local_98);
      for (pl.m_t[1]._4_4_ = 0; pl.m_t[1]._4_4_ < 3; pl.m_t[1]._4_4_ = pl.m_t[1]._4_4_ + 1) {
        pOVar2 = ON_Line::operator[](line,0);
        dVar4 = ON_3dPoint::operator[](pOVar2,pl.m_t[1]._4_4_);
        pOVar2 = ON_Line::operator[](line,1);
        dVar5 = ON_3dPoint::operator[](pOVar2,pl.m_t[1]._4_4_);
        ON_Interval::ON_Interval((ON_Interval *)local_e0,dVar4,dVar5);
        pdVar3 = ON_Interval::operator[]((ON_Interval *)local_e0,0);
        dVar4 = *pdVar3;
        pdVar3 = ON_Interval::operator[]((ON_Interval *)local_e0,1);
        if ((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) {
          Min(&local_108,this);
          pdVar3 = ON_3dPoint::operator[](&local_108,pl.m_t[1]._4_4_);
          dVar4 = ON_Interval::NormalizedParameterAt((ON_Interval *)local_e0,*pdVar3);
          Max(&local_120,this);
          pdVar3 = ON_3dPoint::operator[](&local_120,pl.m_t[1]._4_4_);
          dVar5 = ON_Interval::NormalizedParameterAt((ON_Interval *)local_e0,*pdVar3);
          ON_Interval::ON_Interval(&local_f0,dVar4,dVar5);
          *(double *)(local_c8 + (long)pl.m_t[1]._4_4_ * 0x10) = local_f0.m_t[0];
          adStack_c0[(long)pl.m_t[1]._4_4_ * 2] = local_f0.m_t[1];
        }
        else {
          Min(&local_138,this);
          pdVar3 = ON_3dPoint::operator[](&local_138,pl.m_t[1]._4_4_);
          dVar4 = *pdVar3;
          pdVar3 = ON_Interval::operator[]((ON_Interval *)local_e0,0);
          bVar1 = false;
          if (dVar4 <= *pdVar3) {
            pdVar3 = ON_Interval::operator[]((ON_Interval *)local_e0,0);
            dVar4 = *pdVar3;
            Max(&local_150,this);
            pdVar3 = ON_3dPoint::operator[](&local_150,pl.m_t[1]._4_4_);
            bVar1 = dVar4 <= *pdVar3;
          }
          if (bVar1) {
            ON_Interval::ON_Interval(&local_160,-1.79769313486232e+308,1.79769313486232e+308);
            *(double *)(local_c8 + (long)pl.m_t[1]._4_4_ * 0x10) = local_160.m_t[0];
            adStack_c0[(long)pl.m_t[1]._4_4_ * 2] = local_160.m_t[1];
          }
          else {
            ON_Interval::ON_Interval
                      ((ON_Interval *)(overlap.m_t + 1),-1.23432101234321e+308,
                       -1.23432101234321e+308);
            *(double *)(local_c8 + (long)pl.m_t[1]._4_4_ * 0x10) = overlap.m_t[1];
            adStack_c0[(long)pl.m_t[1]._4_4_ * 2] = local_168;
          }
        }
      }
      ON_Interval::ON_Interval((ON_Interval *)&i,-1.79769313486232e+308,1.79769313486232e+308);
      local_181 = true;
      local_188 = 0;
      while( true ) {
        local_3d9 = false;
        if (local_188 < 3) {
          local_3d9 = local_181;
        }
        if (local_3d9 == false) break;
        local_181 = ON_Interval::Intersection
                              ((ON_Interval *)&i,(ON_Interval *)(local_c8 + (long)local_188 * 0x10))
        ;
        local_188 = local_188 + 1;
      }
      if (local_181 == false) {
        for (local_188 = 0; local_188 < 3; local_188 = local_188 + 1) {
          bVar1 = ON_Interval::Intersection
                            ((ON_Interval *)&i,
                             (ON_Interval *)(local_c8 + (long)((local_188 + 1) % 3) * 0x10),
                             (ON_Interval *)(local_c8 + (long)((local_188 + 2) % 3) * 0x10));
          if (!bVar1) {
            ON_3dVector::ON_3dVector((ON_3dVector *)&n.z,0.0,0.0,0.0);
            pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&n.z,local_188);
            *pdVar3 = 1.0;
            ON_Line::Direction((ON_3dVector *)(ilo + 1),line);
            ON_CrossProduct((ON_3dVector *)local_1f8,(ON_3dVector *)(ilo + 1),(ON_3dVector *)&n.z);
            dVar4 = ON_3dVector::Length((ON_3dVector *)local_1f8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              ON_3dVector::Unitize((ON_3dVector *)local_1f8);
              memset(ihi + 1,0,0xc);
              imin[1] = 1;
              imin[2] = 1;
              ihi[0] = 1;
              stack0xfffffffffffffdcc = 0xffffffffffffffff;
              imin[0] = -1;
              a = 0.0;
              imin[(long)local_188 + 1] = ihi[(long)local_188 + 1];
              for (StdUnit.z._4_4_ = ihi[1]; StdUnit.z._4_4_ <= imin[1];
                  StdUnit.z._4_4_ = StdUnit.z._4_4_ + 1) {
                for (local_1c0 = ihi[2]; local_1c0 <= imin[2]; local_1c0 = local_1c0 + 1) {
                  for (k[0] = ilo[0]; k[0] <= ihi[0]; k[0] = k[0] + 1) {
                    Corner((ON_3dPoint *)&vertex.z,this,StdUnit.z._4_4_,local_1c0,k[0]);
                    ON_3dPoint::operator-(&local_260,(ON_3dPoint *)&vertex.z,&line->from);
                    local_248 = ON_3dVector::operator*((ON_3dVector *)local_1f8,&local_260);
                    if (((a == 0.0) && (!NAN(a))) ||
                       (ABS(local_248) < (double)((ulong)a & (ulong)DAT_009d3010))) {
                      stack0xfffffffffffffdcc = CONCAT44(local_1c0,StdUnit.z._4_4_);
                      imin[0] = k[0];
                      a = local_248;
                    }
                  }
                }
              }
              if (amin._4_4_ < 0) {
                return 0;
              }
              Corner((ON_3dPoint *)&ProjDir.z,this,amin._4_4_,iStack_230,imin[0]);
              dVar4 = ON_3dPoint::operator[](&line->from,local_188);
              pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&ProjDir.z,local_188);
              *pdVar3 = dVar4;
              ON_Line::Direction((ON_3dVector *)&t,line);
              pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&t,local_188);
              *pdVar3 = 0.0;
              ON_3dPoint::operator-((ON_3dVector *)&cp.z,(ON_3dPoint *)&ProjDir.z,&line->from);
              dVar5 = ON_3dVector::operator*((ON_3dVector *)&cp.z,(ON_3dVector *)&t);
              dVar4 = ON_3dVector::LengthSquared((ON_3dVector *)&t);
              dVar5 = dVar5 / dVar4;
              ON_Line::PointAt((ON_3dPoint *)&corner.z,line,dVar5);
              if ((0.0 <= dVar5) && (dVar5 <= 1.0)) {
                dVar4 = ON_3dPoint::operator[](&this->m_min,local_188);
                pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&corner.z,local_188);
                if (dVar4 <= *pdVar3) {
                  pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&corner.z,local_188);
                  dVar4 = *pdVar3;
                  dVar6 = ON_3dPoint::operator[](&this->m_max,local_188);
                  if (dVar4 <= dVar6) {
                    if (t0 != (double *)0x0) {
                      *t0 = dVar5;
                    }
                    if (closest.z != 0.0) {
                      *(double *)closest.z = dVar5;
                    }
                    pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&corner.z,local_188);
                    dVar4 = *pdVar3;
                    pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&ProjDir.z,local_188);
                    *pdVar3 = dVar4;
                    box_point->x = ProjDir.z;
                    box_point->y = vertex.x;
                    box_point->z = vertex.y;
                    return 1;
                  }
                }
              }
            }
          }
        }
        for (StdUnit.z._4_4_ = 0; StdUnit.z._4_4_ < 2; StdUnit.z._4_4_ = StdUnit.z._4_4_ + 1) {
          for (local_1c0 = 0; local_1c0 < 2; local_1c0 = local_1c0 + 1) {
            for (k[0] = 0; k[0] < 2; k[0] = k[0] + 1) {
              Corner((ON_3dPoint *)&tstar,this,StdUnit.z._4_4_,local_1c0,k[0]);
              ON_Line::ClosestPointTo(line,(ON_3dPoint *)&tstar,&cp_1.z);
              ON_Line::PointAt((ON_3dPoint *)&disp.z,line,cp_1.z);
              ON_3dPoint::operator-((ON_3dVector *)&j_1,(ON_3dPoint *)&disp.z,(ON_3dPoint *)&tstar);
              local_331 = true;
              local_338 = 0;
              while( true ) {
                local_411 = false;
                if (local_338 < 2) {
                  local_411 = local_331;
                }
                if (local_411 == false) break;
                if ((local_331 == false) ||
                   (*(int *)((long)&StdUnit.z + (long)local_338 * 4 + 4) == 0)) {
                  pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&j_1,local_338);
                  local_412 = *pdVar3 <= 0.0;
                }
                else {
                  pdVar3 = ON_3dVector::operator[]((ON_3dVector *)&j_1,local_338);
                  local_412 = 0.0 <= *pdVar3;
                }
                local_331 = local_412;
                local_338 = local_338 + 1;
              }
              if (local_331 != false) {
                if (t0 != (double *)0x0) {
                  *t0 = cp_1.z;
                }
                if (closest.z != 0.0) {
                  *(double *)closest.z = cp_1.z;
                }
                box_point->x = tstar;
                box_point->y = corner.x;
                box_point->z = corner.y;
                return 1;
              }
            }
          }
        }
        for (local_188 = 0; local_188 < 2; local_188 = local_188 + 1) {
          pOVar2 = ON_Line::operator[](line,local_188);
          ClosestPoint((ON_3dPoint *)&dot,this,pOVar2);
          local_50 = (undefined1  [8])dot;
          closest.x = local_348;
          closest.y = local_340;
          pOVar2 = ON_Line::operator[](line,local_188);
          ON_3dPoint::operator-(&local_370,(ON_3dPoint *)local_50,pOVar2);
          ON_Line::Direction(&local_388,line);
          local_358 = ON_3dVector::operator*(&local_370,&local_388);
          if (((local_188 == 0) && (local_358 <= 0.0)) || ((local_188 == 1 && (0.0 <= local_358))))
          {
            if (t0 != (double *)0x0) {
              *t0 = (double)local_188;
            }
            if (closest.z != 0.0) {
              *(double *)closest.z = (double)local_188;
            }
            box_point->x = (double)local_50;
            box_point->y = closest.x;
            box_point->z = closest.y;
            return 1;
          }
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
                   ,0x6e6,"","Should never get here.");
        this_local._4_4_ = 0;
      }
      else {
        ON_Interval::ON_Interval(&local_198,0.0,1.0);
        bVar1 = ON_Interval::Intersection((ON_Interval *)&i,&local_198);
        if (bVar1) {
          if (t0 != (double *)0x0) {
            pdVar3 = ON_Interval::operator[]((ON_Interval *)&i,0);
            *t0 = *pdVar3;
          }
          if (closest.z != 0.0) {
            pdVar3 = ON_Interval::operator[]((ON_Interval *)&i,1);
            *(double *)closest.z = *pdVar3;
          }
          pdVar3 = ON_Interval::operator[]((ON_Interval *)&i,0);
          ON_Line::PointAt((ON_3dPoint *)&EndInd,line,*pdVar3);
          box_point->x = EndInd;
          box_point->y = local_1a8;
          box_point->z = local_1a0;
          dVar4 = ON_Interval::Length((ON_Interval *)&i);
          this_local._4_4_ = 2;
          if (0.0 < dVar4) {
            this_local._4_4_ = 3;
          }
        }
        else {
          pdVar3 = ON_Interval::operator[]((ON_Interval *)&i,1);
          dVar4 = (double)(~-(ulong)(*pdVar3 < 0.0) & 0x3ff0000000000000);
          if (t0 != (double *)0x0) {
            *t0 = dVar4;
          }
          if (closest.z != 0.0) {
            *(double *)closest.z = dVar4;
          }
          this_local._4_4_ = 1;
        }
      }
    }
    else {
      ON_Line::PointAt((ON_3dPoint *)local_80,line,0.5);
      if (t0 != (double *)0x0) {
        *t0 = 0.0;
      }
      if (closest.z != 0.0) {
        *(undefined8 *)closest.z = 0x3ff0000000000000;
      }
      ClosestPoint(&local_98,this,(ON_3dPoint *)local_80);
      box_point->x = local_98.x;
      box_point->y = local_98.y;
      box_point->z = local_98.z;
      bVar1 = IsPointIn(this,(ON_3dPoint *)local_80,0);
      this_local._4_4_ = 1;
      if (bVar1) {
        this_local._4_4_ = 3;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BoundingBox::GetClosestPoint( 
  const ON_Line& line, ON_3dPoint& box_point, double* t0, double* t1
  ) const
{
  if(!IsValid() || !line.IsValid()) 
		return 0;			
	
	ON_3dPoint closest;
	
	if(line.Direction().Length()<=ON_SQRT_EPSILON){
		ON_3dPoint center = line.PointAt(.5);
		if(t0) *t0 = 0.0;
		if(t1) *t1 = 1.0;
		box_point = ClosestPoint(center);
		return IsPointIn( center )? 3 : 1;
	}

	ON_Interval over[3];			//parameter overlap for each direction

	for(int j=0; j<3; j++){
		ON_Interval pl( line[0][j], line[1][j]);
		if( pl[0]!=pl[1])
			over[j]= ON_Interval(	pl.NormalizedParameterAt(Min()[j]),
														pl.NormalizedParameterAt(Max()[j])  );
		else 
			if( Min()[j]<=pl[0] && pl[0]<=Max()[j] )
				over[j]=ON_Interval(-ON_DBL_MAX, ON_DBL_MAX);
			else 
				over[j]=ON_Interval(ON_UNSET_VALUE, ON_UNSET_VALUE);
	}



	// Step 1.  Check for an intersection of the infinite line with the box
	ON_Interval overlap(-ON_DBL_MAX, ON_DBL_MAX);	
	bool nonempty=true;
  int i;
	for( i=0;i<3 && nonempty;i++)
		nonempty = overlap.Intersection(over[i]);
	
	if(nonempty){	// infinite line intersects box
		if( overlap.Intersection( ON_Interval(0,1) ) ){
			// Box & Line segment  intersect
			if(t0) *t0 = overlap[0];
			if(t1) *t1 = overlap[1];
			box_point = line.PointAt(overlap[0]);
			return (overlap.Length()>0)? 3 : 2;
		}
		// closest point is at end of line segment
		double EndInd=(overlap[1]<0)? 0.0: 1.0;
		if(t0) *t0 = EndInd;
		if(t1) *t1 = EndInd;
		return 1;
	}


	//  Step 2.  Check for closest point on box edge and line segment interior
	//   In this case when we project orthogonal to the box edge we get a line 
	//   in the plane that doesn't intersect the 2d-box in the plane.  The projection
  //   of the 3d closest point is the closest point of this 2d closest point problem.
	int k[3];
	for(i=0; i<3; i++)
  {
		// Project box and line onto coord plane with normal Unit(i).

		if(!overlap.Intersection( over[(i+1)%3], over[(i+2)%3] )){	
			// Projected line doesnt intersect the projexted box.  
			// Find the closest  vertex of the projected box.  
			ON_3dVector StdUnit(0,0,0);
			StdUnit[i]=1.0;
			ON_3dVector n = ON_CrossProduct(line.Direction(), StdUnit);
			if(n.Length()==0)
				continue;
			n.Unitize();
			int ilo[3]={0,0,0};
			int ihi[3]={1,1,1};
      int imin[3]={-1,-1,-1};
			double amin=0.0;
			ihi[i]=ilo[i];
			for(k[0]=ilo[0];  k[0]<=ihi[0]; k[0]++)
				for(k[1]=ilo[1];  k[1]<=ihi[1]; k[1]++)
					for(k[2]=ilo[2];  k[2]<=ihi[2]; k[2]++){
						double a = n*(Corner(k[0],k[1],k[2]) - line.from);
						if(amin == 0.0 || fabs(a)<fabs(amin))
            {
							amin= a;
							imin[0]=k[0]; imin[1]=k[1]; imin[2]=k[2];
						}
			}
      if ( imin[0] < 0 )
      {
        return 0;
      }
			ON_3dPoint vertex = Corner(imin[0],imin[1],imin[2]);
			vertex[i] = line.from[i];
			// Solve for 2d-closest point between closest corner and projected line 
			ON_3dVector ProjDir = line.Direction();
			ProjDir[i]=0.0;
			double t = ( vertex - line.from)*ProjDir / ProjDir.LengthSquared();
			ON_3dPoint cp = line.PointAt(t);
			if( 0<=t && t<=1 && m_min[i]<=cp[i] &&cp[i]<= m_max[i] ){
				if(t0) *t0 = t;		// found the  closest point 
				if(t1) *t1 = t;
				vertex[i] =  cp[i];
				box_point = vertex;
				return 1;
			}
		}
	}

	//Step 3. Check each Corner of the box for closest points
	for( k[0]=0; k[0]<2; k[0]++)
		for( k[1]=0; k[1]<2; k[1]++)
			for( k[2]=0; k[2]<2; k[2]++){
				ON_3dPoint corner = Corner(k[0],k[1],k[2]);
				double tstar;
				line.ClosestPointTo( corner, &tstar );
				ON_3dPoint cp = line.PointAt( tstar);
				ON_3dVector disp = cp - corner;
				bool InNCone=true;
				for(int j=0;j<2 && InNCone;j++){
					InNCone = InNCone && ( k[j] )? disp[j]>=0 : disp[j]<=0  ;
				}
				if(InNCone){
					if(t0) *t0 = tstar;
					if(t1) *t1 = tstar;
					box_point = corner;
					return 1;
				} 
	}

	//Step 4. Closest point is at a line end
	for(i=0; i<2; i++){
		closest = ClosestPoint(line[i]);
		double dot = (closest - line[i]) * line.Direction();
		if( (i==0 && dot<= 0) || (i==1 && dot>=0) )
    {
			if(t0) *t0 = i;
			if(t1) *t1 = i;
			box_point = closest;
			return 1;
		}
	}

  ON_ERROR("Should never get here.");
	return 0;  
}